

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestParser.cpp
# Opt level: O2

void __thiscall UnitTest_parser_exp2::Run(UnitTest_parser_exp2 *this)

{
  __uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> _Var1;
  ExpressionList *pEVar2;
  pointer puVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  allocator local_41;
  string local_40;
  __uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> local_20;
  
  std::__cxx11::string::string((string *)&local_40,"a = 1 + 2 + 3 * 4",&local_41);
  anon_unknown.dwarf_6bcd::Parse((anon_unknown_dwarf_6bcd *)&local_20,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  pEVar2 = ASTFind<luna::ExpressionList,AcceptAST>
                     ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                      &local_20,(AcceptAST *)&local_40);
  puVar3 = (pEVar2->exp_list_).
           super__Vector_base<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>,_std::allocator<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((long)(pEVar2->exp_list_).
            super__Vector_base<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>,_std::allocator<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish - (long)puVar3 != 8) {
    std::__cxx11::string::string
              ((string *)&local_40,"\'exp_list->exp_list_.size() == 1\'",&local_41);
    UnitTestBase::Error(&this->super_UnitTestBase,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    puVar3 = (pEVar2->exp_list_).
             super__Vector_base<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>,_std::allocator<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  }
  _Var1._M_t.super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
  super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl =
       (puVar3->_M_t).
       super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t;
  if ((_Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>)
      _Var1._M_t.super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
      super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl == (SyntaxTree *)0x0) {
LAB_00147de4:
    std::__cxx11::string::string((string *)&local_40,"\'bin_exp\'",&local_41);
    UnitTestBase::Error(&this->super_UnitTestBase,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    lVar4 = 0;
  }
  else {
    lVar4 = __dynamic_cast(_Var1._M_t.
                           super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>
                           .super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl,
                           &luna::SyntaxTree::typeinfo,&luna::BinaryExpression::typeinfo,0);
    if (lVar4 == 0) goto LAB_00147de4;
  }
  if (*(int *)(lVar4 + 0x30) != 0x2b) {
    std::__cxx11::string::string
              ((string *)&local_40,"\'bin_exp->op_token_.token_ == \'+\'\'",&local_41);
    UnitTestBase::Error(&this->super_UnitTestBase,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  if (*(long *)(lVar4 + 8) == 0) {
LAB_00147e6e:
    std::__cxx11::string::string((string *)&local_40,"\'left\'",&local_41);
    UnitTestBase::Error(&this->super_UnitTestBase,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    lVar5 = 0;
  }
  else {
    lVar5 = __dynamic_cast(*(long *)(lVar4 + 8),&luna::SyntaxTree::typeinfo,
                           &luna::BinaryExpression::typeinfo,0);
    if (lVar5 == 0) goto LAB_00147e6e;
  }
  if (*(int *)(lVar5 + 0x30) != 0x2b) {
    std::__cxx11::string::string
              ((string *)&local_40,"\'left->op_token_.token_ == \'+\'\'",&local_41);
    UnitTestBase::Error(&this->super_UnitTestBase,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  if (*(long *)(lVar5 + 8) == 0) {
LAB_00147ef5:
    std::__cxx11::string::string
              ((string *)&local_40,"\'dynamic_cast<luna::Terminator *>(left->left_.get())\'",
               &local_41);
    UnitTestBase::Error(&this->super_UnitTestBase,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  else {
    lVar6 = __dynamic_cast(*(long *)(lVar5 + 8),&luna::SyntaxTree::typeinfo,
                           &luna::Terminator::typeinfo,0);
    if (lVar6 == 0) goto LAB_00147ef5;
  }
  if (*(long *)(lVar5 + 0x10) == 0) {
LAB_00147f45:
    std::__cxx11::string::string
              ((string *)&local_40,"\'dynamic_cast<luna::Terminator *>(left->right_.get())\'",
               &local_41);
    UnitTestBase::Error(&this->super_UnitTestBase,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  else {
    lVar5 = __dynamic_cast(*(long *)(lVar5 + 0x10),&luna::SyntaxTree::typeinfo,
                           &luna::Terminator::typeinfo,0);
    if (lVar5 == 0) goto LAB_00147f45;
  }
  if (*(long *)(lVar4 + 0x10) == 0) {
LAB_00147f98:
    std::__cxx11::string::string((string *)&local_40,"\'right\'",&local_41);
    UnitTestBase::Error(&this->super_UnitTestBase,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    lVar4 = 0;
  }
  else {
    lVar4 = __dynamic_cast(*(long *)(lVar4 + 0x10),&luna::SyntaxTree::typeinfo,
                           &luna::BinaryExpression::typeinfo,0);
    if (lVar4 == 0) goto LAB_00147f98;
  }
  if (*(int *)(lVar4 + 0x30) != 0x2a) {
    std::__cxx11::string::string
              ((string *)&local_40,"\'right->op_token_.token_ == \'*\'\'",&local_41);
    UnitTestBase::Error(&this->super_UnitTestBase,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  if (*(long *)(lVar4 + 8) == 0) {
LAB_0014801f:
    std::__cxx11::string::string
              ((string *)&local_40,"\'dynamic_cast<luna::Terminator *>(right->left_.get())\'",
               &local_41);
    UnitTestBase::Error(&this->super_UnitTestBase,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  else {
    lVar5 = __dynamic_cast(*(long *)(lVar4 + 8),&luna::SyntaxTree::typeinfo,
                           &luna::Terminator::typeinfo,0);
    if (lVar5 == 0) goto LAB_0014801f;
  }
  if (*(long *)(lVar4 + 0x10) != 0) {
    lVar4 = __dynamic_cast(*(long *)(lVar4 + 0x10),&luna::SyntaxTree::typeinfo,
                           &luna::Terminator::typeinfo,0);
    if (lVar4 != 0) goto LAB_0014809c;
  }
  std::__cxx11::string::string
            ((string *)&local_40,"\'dynamic_cast<luna::Terminator *>(right->right_.get())\'",
             &local_41);
  UnitTestBase::Error(&this->super_UnitTestBase,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
LAB_0014809c:
  if (local_20._M_t.
      super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
      super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl !=
      (_Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>)0x0) {
    (*(*(_func_int ***)
        local_20._M_t.
        super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
        super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl)[1])();
  }
  return;
}

Assistant:

TEST_CASE(parser_exp2)
{
    auto root = Parse("a = 1 + 2 + 3 * 4");
    auto exp_list = ASTFind<luna::ExpressionList>(root, AcceptAST());
    EXPECT_TRUE(exp_list->exp_list_.size() == 1);
    auto &exp = exp_list->exp_list_[0];
    auto bin_exp = dynamic_cast<luna::BinaryExpression *>(exp.get());
    EXPECT_TRUE(bin_exp);
    EXPECT_TRUE(bin_exp->op_token_.token_ == '+');

    // 1 + 2
    auto left = dynamic_cast<luna::BinaryExpression *>(bin_exp->left_.get());
    EXPECT_TRUE(left);
    EXPECT_TRUE(left->op_token_.token_ == '+');
    EXPECT_TRUE(dynamic_cast<luna::Terminator *>(left->left_.get()));
    EXPECT_TRUE(dynamic_cast<luna::Terminator *>(left->right_.get()));

    // 3 * 4
    auto right = dynamic_cast<luna::BinaryExpression *>(bin_exp->right_.get());
    EXPECT_TRUE(right);
    EXPECT_TRUE(right->op_token_.token_ == '*');
    EXPECT_TRUE(dynamic_cast<luna::Terminator *>(right->left_.get()));
    EXPECT_TRUE(dynamic_cast<luna::Terminator *>(right->right_.get()));
}